

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_geometry_device.cpp
# Opt level: O0

Vec3fa embree::interpolate_catmull_rom(TutorialData *data,uint primID,float u)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  Vec3fa VVar2;
  float n1;
  float n0;
  float s;
  float t;
  Vec3fa c3;
  Vec3fa c2;
  Vec3fa c1;
  Vec3fa c0;
  undefined8 local_538;
  undefined8 uStack_530;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float n3;
  float n2;
  
  local_138 = (float)local_538;
  fStack_134 = (float)((ulong)local_538 >> 0x20);
  fStack_130 = (float)uStack_530;
  fStack_12c = (float)((ulong)uStack_530 >> 0x20);
  uVar1 = CONCAT44(fStack_134 * 0.5,local_138 * 0.5);
  *in_RDI = uVar1;
  in_RDI[1] = CONCAT44(fStack_12c * 0.5,fStack_130 * 0.5);
  VVar2.field_0._8_8_ = 0x3f0000003f000000;
  VVar2.field_0._0_8_ = uVar1;
  return (Vec3fa)VVar2.field_0;
}

Assistant:

Vec3fa interpolate_catmull_rom(const TutorialData& data, unsigned int primID, float u)
{
  const Vec3fa c0 = ((Vec3fa*) data.hair_vertex_colors)[primID+0];
  const Vec3fa c1 = ((Vec3fa*) data.hair_vertex_colors)[primID+1];
  const Vec3fa c2 = ((Vec3fa*) data.hair_vertex_colors)[primID+2];
  const Vec3fa c3 = ((Vec3fa*) data.hair_vertex_colors)[primID+3];
  const float t  = u;
  const float s  = 1.0f - u;
  const float n0 = - t * s * s;
  const float n1 = 2.0f + t * t * (3.0f * t - 5.0f);
  const float n2 = 2.0f + s * s * (3.0f * s - 5.0f);
  const float n3 = - s * t * t;
  return Vec3fa(0.5f*(n0*c0 + n1*c1 + n2*c2 + n3*c3));
}